

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetMmapLimit(Btree *p,sqlite3_int64 szMmap)

{
  int *piVar1;
  Pager *pPager;
  int extraout_EAX;
  int iVar2;
  BtShared *pBVar3;
  
  pBVar3 = p->pBt;
  sqlite3BtreeEnter(p);
  pPager = pBVar3->pPager;
  pPager->szMmap = szMmap;
  pagerFixMaplimit(pPager);
  iVar2 = extraout_EAX;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      pBVar3 = p->pBt;
      if (pBVar3->mutex != (sqlite3_mutex *)0x0) {
        pBVar3 = (BtShared *)(*sqlite3Config.mutex.xMutexLeave)(pBVar3->mutex);
      }
      iVar2 = (int)pBVar3;
      p->locked = '\0';
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetMmapLimit(Btree *p, sqlite3_int64 szMmap){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetMmapLimit(pBt->pPager, szMmap);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}